

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_advance_to_peeked(Parser *this)

{
  pfn_error p_Var1;
  Location LVar2;
  ro_substr chars;
  bool bVar3;
  error_flags eVar4;
  size_t sVar5;
  Parser *in_RDI;
  Parser *unaff_retaddr;
  char msg [77];
  size_t in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  Location *this_00;
  size_t in_stack_ffffffffffffff60;
  basic_substring<const_char> *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  size_t local_80;
  undefined1 local_78 [24];
  Parser *in_stack_ffffffffffffffa0;
  Parser *in_stack_ffffffffffffffd0;
  basic_substring<char_const> local_20 [24];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  _line_progressed(unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  _line_ended(in_stack_ffffffffffffffd0);
  basic_substring<char_const>::basic_substring<3ul>(local_20,(char (*) [3])0x40e0fc);
  chars.len = in_stack_ffffffffffffff78;
  chars.str = in_stack_ffffffffffffff70;
  sVar5 = basic_substring<const_char>::first_of
                    (in_stack_ffffffffffffff68,chars,in_stack_ffffffffffffff60);
  if (sVar5 != 0xffffffffffffffff) {
    memcpy(local_78,
           "check failed: (m_state->line_contents.rem.first_of(\"\\r\\n\") == csubstr::npos)",0x4d);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    this_00 = (Location *)local_78;
    Location::Location(this_00,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    LVar2.super_LineCol.line = (size_t)in_stack_ffffffffffffff68;
    LVar2.super_LineCol.offset = in_stack_ffffffffffffff60;
    LVar2.super_LineCol.col = (size_t)in_stack_ffffffffffffff70;
    LVar2.name.str = (char *)in_stack_ffffffffffffff78;
    LVar2.name.len = local_80;
    (*p_Var1)((char *)this_00,0x4d,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
  }
  _scan_line(in_stack_ffffffffffffffa0);
  bVar3 = _finished_file(in_RDI);
  return !bVar3;
}

Assistant:

bool Parser::_advance_to_peeked()
{
    _line_progressed(m_state->line_contents.rem.len);
    _line_ended(); // advances to the peeked-at line, consuming all remaining (probably newline) characters on the current line
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.rem.first_of("\r\n") == csubstr::npos);
    _c4dbgpf("advance to peeked: scan more... pos={} len={}", m_state->pos.offset, m_buf.len);
    _scan_line();  // puts the peeked-at line in the buffer
    if(_finished_file())
    {
        _c4dbgp("rscalar: finished file!");
        return false;
    }
    return true;
}